

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O3

PyObject *
vecToList<HighFreqDataType>::convert
          (vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *vec)

{
  list *this;
  pointer pHVar1;
  ulong uVar2;
  long lVar3;
  
  this = (list *)operator_new(8);
  boost::python::detail::list_base::list_base((list_base *)this);
  pHVar1 = (vec->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      boost::python::list::append<HighFreqDataType>
                (this,(HighFreqDataType *)
                      ((long)&(pHVar1->super_NetworkDataType)._vptr_NetworkDataType + lVar3));
      uVar2 = uVar2 + 1;
      pHVar1 = (vec->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x90;
    } while (uVar2 < (ulong)(((long)(vec->
                                    super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 4)
                            * -0x71c71c71c71c71c7));
  }
  return (this->super_list_base).super_object.super_object_base.m_ptr;
}

Assistant:

static PyObject* convert(const std::vector<T>& vec){
        list* l = new list();
        for(size_t i = 0; i < vec.size(); i++){
            l->append(vec[i]);
        }
        return l->ptr();
    }